

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TTSnapValues.cpp
# Opt level: O0

void TTD::NSSnapValues::ParseScriptFunctionScopeInfo
               (ScriptFunctionScopeInfo *funcScopeInfo,bool readSeparator,FileReader *reader,
               SlabAllocator *alloc)

{
  uint32 uVar1;
  ScopeType SVar2;
  TTD_PTR_ID TVar3;
  TTD_LOG_PTR_ID TVar4;
  ScopeInfoEntry *pSVar5;
  uint local_2c;
  uint32 i;
  SlabAllocator *alloc_local;
  FileReader *reader_local;
  bool readSeparator_local;
  ScriptFunctionScopeInfo *funcScopeInfo_local;
  
  (*reader->_vptr_FileReader[6])
            (reader,(ulong)readSeparator & 1,reader,
             CONCAT71((int7)((ulong)alloc >> 8),readSeparator) & 0xffffffffffffff01);
  TVar3 = FileReader::ReadAddr(reader,scopeId,false);
  funcScopeInfo->ScopeId = TVar3;
  TVar4 = FileReader::ReadLogTag(reader,ctxTag,true);
  funcScopeInfo->ScriptContextLogId = TVar4;
  uVar1 = FileReader::ReadUInt32(reader,count,true);
  funcScopeInfo->ScopeCount = (uint16)uVar1;
  FileReader::ReadSequenceStart_WDefaultKey(reader,true);
  pSVar5 = SlabAllocatorBase<0>::SlabAllocateArray<TTD::NSSnapValues::ScopeInfoEntry>
                     (alloc,(ulong)funcScopeInfo->ScopeCount);
  funcScopeInfo->ScopeArray = pSVar5;
  local_2c = 0;
  while( true ) {
    if (funcScopeInfo->ScopeCount <= local_2c) break;
    (*reader->_vptr_FileReader[6])(reader,(ulong)(local_2c != 0));
    SVar2 = FileReader::ReadTag<Js::ScopeType>(reader,scopeType,false);
    funcScopeInfo->ScopeArray[local_2c].Tag = SVar2;
    TVar3 = FileReader::ReadAddr(reader,subscopeId,true);
    funcScopeInfo->ScopeArray[local_2c].IDValue = TVar3;
    (*reader->_vptr_FileReader[7])();
    local_2c = local_2c + 1;
  }
  (*reader->_vptr_FileReader[5])();
  (*reader->_vptr_FileReader[7])();
  return;
}

Assistant:

void ParseScriptFunctionScopeInfo(ScriptFunctionScopeInfo* funcScopeInfo, bool readSeparator, FileReader* reader, SlabAllocator& alloc)
        {
            reader->ReadRecordStart(readSeparator);

            funcScopeInfo->ScopeId = reader->ReadAddr(NSTokens::Key::scopeId);
            funcScopeInfo->ScriptContextLogId = reader->ReadLogTag(NSTokens::Key::ctxTag, true);
            funcScopeInfo->ScopeCount = (uint16)reader->ReadUInt32(NSTokens::Key::count, true);

            reader->ReadSequenceStart_WDefaultKey(true);

            funcScopeInfo->ScopeArray = alloc.SlabAllocateArray<ScopeInfoEntry>(funcScopeInfo->ScopeCount);
            for(uint32 i = 0; i < funcScopeInfo->ScopeCount; ++i)
            {
                reader->ReadRecordStart(i != 0);

                funcScopeInfo->ScopeArray[i].Tag = reader->ReadTag<Js::ScopeType>(NSTokens::Key::scopeType);
                funcScopeInfo->ScopeArray[i].IDValue = reader->ReadAddr(NSTokens::Key::subscopeId, true);

                reader->ReadRecordEnd();
            }

            reader->ReadSequenceEnd();

            reader->ReadRecordEnd();
        }